

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

CharReader * __thiscall Json::CharReaderBuilder::newCharReader(CharReaderBuilder *this)

{
  bool collectComments;
  bool bVar1;
  UInt UVar2;
  Value *pVVar3;
  CharReader *this_00;
  Value *this_01;
  OurFeatures features;
  OurFeatures local_38;
  
  this_01 = &this->settings_;
  pVVar3 = Value::operator[](this_01,"collectComments");
  collectComments = Value::asBool(pVVar3);
  local_38.allowComments_ = false;
  local_38.allowTrailingCommas_ = false;
  local_38.strictRoot_ = false;
  local_38.allowDroppedNullPlaceholders_ = false;
  local_38.allowNumericKeys_ = false;
  local_38.allowSingleQuotes_ = false;
  local_38.failIfExtra_ = false;
  local_38.rejectDupKeys_ = false;
  local_38.allowSpecialFloats_ = false;
  local_38.skipBom_ = false;
  local_38._10_6_ = 0;
  local_38.stackLimit_ = 0;
  pVVar3 = Value::operator[](this_01,"allowComments");
  bVar1 = Value::asBool(pVVar3);
  local_38.allowComments_ = bVar1;
  pVVar3 = Value::operator[](this_01,"allowTrailingCommas");
  bVar1 = Value::asBool(pVVar3);
  local_38.allowTrailingCommas_ = bVar1;
  pVVar3 = Value::operator[](this_01,"strictRoot");
  bVar1 = Value::asBool(pVVar3);
  local_38.strictRoot_ = bVar1;
  pVVar3 = Value::operator[](this_01,"allowDroppedNullPlaceholders");
  bVar1 = Value::asBool(pVVar3);
  local_38.allowDroppedNullPlaceholders_ = bVar1;
  pVVar3 = Value::operator[](this_01,"allowNumericKeys");
  bVar1 = Value::asBool(pVVar3);
  local_38.allowNumericKeys_ = bVar1;
  pVVar3 = Value::operator[](this_01,"allowSingleQuotes");
  bVar1 = Value::asBool(pVVar3);
  local_38.allowSingleQuotes_ = bVar1;
  pVVar3 = Value::operator[](this_01,"stackLimit");
  UVar2 = Value::asUInt(pVVar3);
  local_38.stackLimit_ = (size_t)UVar2;
  pVVar3 = Value::operator[](this_01,"failIfExtra");
  bVar1 = Value::asBool(pVVar3);
  local_38.failIfExtra_ = bVar1;
  pVVar3 = Value::operator[](this_01,"rejectDupKeys");
  bVar1 = Value::asBool(pVVar3);
  local_38.rejectDupKeys_ = bVar1;
  pVVar3 = Value::operator[](this_01,"allowSpecialFloats");
  bVar1 = Value::asBool(pVVar3);
  local_38.allowSpecialFloats_ = bVar1;
  pVVar3 = Value::operator[](this_01,"skipBom");
  bVar1 = Value::asBool(pVVar3);
  local_38.skipBom_ = bVar1;
  this_00 = (CharReader *)operator_new(0x10);
  OurCharReader::OurCharReader((OurCharReader *)this_00,collectComments,&local_38);
  return this_00;
}

Assistant:

CharReader* CharReaderBuilder::newCharReader() const {
  bool collectComments = settings_["collectComments"].asBool();
  OurFeatures features = OurFeatures::all();
  features.allowComments_ = settings_["allowComments"].asBool();
  features.allowTrailingCommas_ = settings_["allowTrailingCommas"].asBool();
  features.strictRoot_ = settings_["strictRoot"].asBool();
  features.allowDroppedNullPlaceholders_ =
      settings_["allowDroppedNullPlaceholders"].asBool();
  features.allowNumericKeys_ = settings_["allowNumericKeys"].asBool();
  features.allowSingleQuotes_ = settings_["allowSingleQuotes"].asBool();

  // Stack limit is always a size_t, so we get this as an unsigned int
  // regardless of it we have 64-bit integer support enabled.
  features.stackLimit_ = static_cast<size_t>(settings_["stackLimit"].asUInt());
  features.failIfExtra_ = settings_["failIfExtra"].asBool();
  features.rejectDupKeys_ = settings_["rejectDupKeys"].asBool();
  features.allowSpecialFloats_ = settings_["allowSpecialFloats"].asBool();
  features.skipBom_ = settings_["skipBom"].asBool();
  return new OurCharReader(collectComments, features);
}